

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O0

upb_Array *
upb_Array_DeepClone(upb_Array *array,upb_CType value_type,upb_MiniTable *sub,upb_Arena *arena)

{
  _Bool _Var1;
  undefined1 local_60 [8];
  upb_MessageValue val;
  size_t i;
  upb_Array *cloned_array;
  size_t sStack_38;
  int lg2;
  size_t size;
  upb_Arena *arena_local;
  upb_MiniTable *sub_local;
  upb_Array *puStack_18;
  upb_CType value_type_local;
  upb_Array *array_local;
  
  size = (size_t)arena;
  arena_local = (upb_Arena *)sub;
  sub_local._4_4_ = value_type;
  puStack_18 = array;
  sStack_38 = upb_Array_Size(array);
  cloned_array._4_4_ = _upb_CType_SizeLg2_dont_copy_me__upb_internal_use_only(sub_local._4_4_);
  i = (size_t)_upb_Array_New_dont_copy_me__upb_internal_use_only
                        ((upb_Arena *)size,sStack_38,cloned_array._4_4_);
  if ((upb_Array *)i == (upb_Array *)0x0) {
    array_local = (upb_Array *)0x0;
  }
  else {
    _Var1 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only
                      ((upb_Array *)i,sStack_38,(upb_Arena *)size);
    if (_Var1) {
      for (val.str_val.size = 0; val.str_val.size < sStack_38;
          val.str_val.size = val.str_val.size + 1) {
        _local_60 = upb_Array_Get(puStack_18,val.str_val.size);
        _Var1 = upb_Clone_MessageValue
                          (local_60,sub_local._4_4_,(upb_MiniTable *)arena_local,(upb_Arena *)size);
        if (!_Var1) {
          return (upb_Array *)0x0;
        }
        upb_Array_Set((upb_Array *)i,val.str_val.size,_local_60);
      }
      array_local = (upb_Array *)i;
    }
    else {
      array_local = (upb_Array *)0x0;
    }
  }
  return array_local;
}

Assistant:

upb_Array* upb_Array_DeepClone(const upb_Array* array, upb_CType value_type,
                               const upb_MiniTable* sub, upb_Arena* arena) {
  const size_t size = upb_Array_Size(array);
  const int lg2 = UPB_PRIVATE(_upb_CType_SizeLg2)(value_type);
  upb_Array* cloned_array = UPB_PRIVATE(_upb_Array_New)(arena, size, lg2);
  if (!cloned_array) {
    return NULL;
  }
  if (!UPB_PRIVATE(_upb_Array_ResizeUninitialized)(cloned_array, size, arena)) {
    return NULL;
  }
  for (size_t i = 0; i < size; ++i) {
    upb_MessageValue val = upb_Array_Get(array, i);
    if (!upb_Clone_MessageValue(&val, value_type, sub, arena)) {
      return NULL;
    }
    upb_Array_Set(cloned_array, i, val);
  }
  return cloned_array;
}